

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O1

double xc_integrate(integr_fn *func,void *ex,double a,double b)

{
  double *alist__;
  double *blist;
  double *rlist;
  double *elist;
  int *iord;
  int limit;
  void *local_78;
  double epsrel;
  double epsabs;
  double b_local;
  double a_local;
  int last;
  int ierr;
  int neval;
  double abserr;
  double result;
  
  epsabs = 1e-10;
  epsrel = 1e-10;
  limit = 1000;
  local_78 = ex;
  b_local = b;
  a_local = a;
  alist__ = (double *)malloc(8000);
  blist = (double *)malloc(8000);
  rlist = (double *)malloc(8000);
  elist = (double *)malloc(8000);
  iord = (int *)malloc(4000);
  xc_rdqagse(func,local_78,&a_local,&b_local,&epsabs,&epsrel,&limit,&result,&abserr,&neval,&ierr,
             alist__,blist,rlist,elist,iord,&last);
  free(alist__);
  free(blist);
  free(rlist);
  free(elist);
  free(iord);
  return result;
}

Assistant:

GPU_FUNCTION double xc_integrate(integr_fn func, void *ex, double a, double b)
{
  double epsabs, epsrel, result, abserr, *alist, *blist, *rlist, *elist;
  int limit, neval, ierr, *iord, last;

  epsabs = 1e-10;
  epsrel = 1e-10;

  limit  = 1000;
  alist = (double *)malloc(limit*sizeof(double));
  blist = (double *)malloc(limit*sizeof(double));
  rlist = (double *)malloc(limit*sizeof(double));
  elist = (double *)malloc(limit*sizeof(double));
  iord  = (int   *)malloc(limit*sizeof(int));

  xc_rdqagse(func, ex, &a, &b, &epsabs, &epsrel, &limit, &result, &abserr, &neval, &ierr,
	    alist, blist, rlist, elist, iord, &last);

  free(alist);
  free(blist);
  free(rlist);
  free(elist);
  free(iord);

  return result;
}